

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurseSolution.cpp
# Opt level: O0

bool __thiscall
NurseSolution::hasTurnConflict(NurseSolution *this,Turn *turnToCheck,Turn *turnToIgnore)

{
  anon_class_16_2_b3a42d91_for__M_pred __pred;
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  Turn *local_20;
  Turn *turnToIgnore_local;
  Turn *turnToCheck_local;
  NurseSolution *this_local;
  
  local_20 = turnToIgnore;
  turnToIgnore_local = turnToCheck;
  turnToCheck_local = (Turn *)this;
  __first = std::begin<std::vector<Turn*,std::allocator<Turn*>>>(&this->turns);
  __last = std::end<std::vector<Turn*,std::allocator<Turn*>>>(&this->turns);
  __pred.turnToCheck = &turnToIgnore_local;
  __pred.turnToIgnore = &local_20;
  bVar1 = std::
          any_of<__gnu_cxx::__normal_iterator<Turn*const*,std::vector<Turn*,std::allocator<Turn*>>>,NurseSolution::hasTurnConflict(Turn_const*,Turn_const*)const::__0>
                    ((__normal_iterator<Turn_*const_*,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>
                      )__first._M_current,
                     (__normal_iterator<Turn_*const_*,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>
                      )__last._M_current,__pred);
  return bVar1;
}

Assistant:

bool NurseSolution::hasTurnConflict(const Turn *turnToCheck, const Turn *turnToIgnore) const {
    return any_of(begin(turns), end(turns), [&](Turn* turnElem) -> bool {

        if (turnToIgnore != nullptr && turnElem->getId() == turnToIgnore->getId())
            return false;

        if (turnElem->getDay() == turnToCheck->getDay() - 1) {
            return turnElem->getShiftType()->isForbiddenShift(turnToCheck->getShiftType()->getId());
        } else if (turnElem->getDay() == turnToCheck->getDay() + 1) {
            return turnToCheck->getShiftType()->isForbiddenShift(turnElem->getShiftType()->getId());
        }

        return false;
    });
}